

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatingDisplay.cpp
# Opt level: O1

void __thiscall FloatingDisplay::setSynthRoute(FloatingDisplay *this,SynthRoute *useSynthRoute)

{
  MidiMessageLEDWidget *this_00;
  bool state;
  
  if (this->synthRoute != (SynthRoute *)0x0) {
    SynthRoute::disconnectSynth
              (this->synthRoute,"2stateChanged(SynthState)",(QObject *)this,
               "1handleSynthStateChange(SynthState)");
    SynthRoute::disconnectReportHandler
              (this->synthRoute,"2lcdStateChanged()",(QObject *)this->lcdWidget,"1handleLCDUpdate()"
              );
    SynthRoute::disconnectReportHandler
              (this->synthRoute,"2midiMessageLEDStateChanged(bool)",(QObject *)this,
               "1handleMidiMessageLEDUpdate(bool)");
  }
  this->synthRoute = useSynthRoute;
  LCDWidget::setSynthRoute(this->lcdWidget,useSynthRoute);
  if (this->synthRoute != (SynthRoute *)0x0) {
    SynthRoute::connectSynth
              (this->synthRoute,"2stateChanged(SynthState)",(QObject *)this,
               "1handleSynthStateChange(SynthState)");
    SynthRoute::connectReportHandler
              (this->synthRoute,"2lcdStateChanged()",(QObject *)this->lcdWidget,"1handleLCDUpdate()"
              );
    SynthRoute::connectReportHandler
              (this->synthRoute,"2midiMessageLEDStateChanged(bool)",(QObject *)this,
               "1handleMidiMessageLEDUpdate(bool)");
  }
  this_00 = this->midiMessageLED;
  state = LCDWidget::updateDisplayText(this->lcdWidget);
  MidiMessageLEDWidget::setState(this_00,state);
  return;
}

Assistant:

void FloatingDisplay::setSynthRoute(SynthRoute *useSynthRoute) {
	if (synthRoute != NULL) {
		synthRoute->disconnectSynth(SIGNAL(stateChanged(SynthState)), this, SLOT(handleSynthStateChange(SynthState)));
		synthRoute->disconnectReportHandler(SIGNAL(lcdStateChanged()), lcdWidget, SLOT(handleLCDUpdate()));
		synthRoute->disconnectReportHandler(SIGNAL(midiMessageLEDStateChanged(bool)), this, SLOT(handleMidiMessageLEDUpdate(bool)));
	}
	synthRoute = useSynthRoute;
	lcdWidget->setSynthRoute(useSynthRoute);
	if (synthRoute != NULL) {
		synthRoute->connectSynth(SIGNAL(stateChanged(SynthState)), this, SLOT(handleSynthStateChange(SynthState)));
		synthRoute->connectReportHandler(SIGNAL(lcdStateChanged()), lcdWidget, SLOT(handleLCDUpdate()));
		synthRoute->connectReportHandler(SIGNAL(midiMessageLEDStateChanged(bool)), this, SLOT(handleMidiMessageLEDUpdate(bool)));
	}
	midiMessageLED->setState(lcdWidget->updateDisplayText());
}